

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kLiveConstraints.c
# Opt level: O0

Aig_Man_t * createNewAigWith0LivePo(Aig_Man_t *pAig,Vec_Ptr_t *signalList,int *index0Live)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Aig_Man_t *p;
  size_t sVar3;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  Aig_Obj_t *p1;
  int local_3c;
  int i;
  Aig_Obj_t *pObjNewPoDriver;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNewAig;
  int *index0Live_local;
  Vec_Ptr_t *signalList_local;
  Aig_Man_t *pAig_local;
  
  iVar2 = Aig_ManObjNumMax(pAig);
  p = Aig_ManStart(iVar2);
  sVar3 = strlen(pAig->pName);
  pcVar4 = (char *)malloc(sVar3 + 7);
  p->pName = pcVar4;
  sprintf(p->pName,"%s_%s",pAig->pName,"0Live");
  p->pSpec = (char *)0x0;
  pAVar5 = Aig_ManConst1(pAig);
  pAVar6 = Aig_ManConst1(p);
  (pAVar5->field_5).pData = pAVar6;
  for (local_3c = 0; iVar2 = Saig_ManPiNum(pAig), local_3c < iVar2; local_3c = local_3c + 1) {
    pvVar7 = Vec_PtrEntry(pAig->vCis,local_3c);
    pAVar5 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
  }
  for (local_3c = 0; iVar2 = Saig_ManRegNum(pAig), local_3c < iVar2; local_3c = local_3c + 1) {
    pVVar1 = pAig->vCis;
    iVar2 = Saig_ManPiNum(pAig);
    pvVar7 = Vec_PtrEntry(pVVar1,local_3c + iVar2);
    pAVar5 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
  }
  for (local_3c = 0; iVar2 = Vec_PtrSize(pAig->vObjs), local_3c < iVar2; local_3c = local_3c + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_3c);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar5), iVar2 != 0)) {
      pAVar6 = Aig_ObjChild0Copy(pAVar5);
      p1 = Aig_ObjChild1Copy(pAVar5);
      pAVar6 = Aig_And(p,pAVar6,p1);
      (pAVar5->field_5).pData = pAVar6;
    }
  }
  for (local_3c = 0; iVar2 = Saig_ManPoNum(pAig), local_3c < iVar2; local_3c = local_3c + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_3c);
    pAVar6 = Aig_ObjChild0Copy(pAVar5);
    pAVar6 = Aig_ObjCreateCo(p,pAVar6);
    (pAVar5->field_5).pData = pAVar6;
  }
  pAVar5 = createConstrained0LiveCone(p,signalList);
  Aig_ObjCreateCo(p,pAVar5);
  *index0Live = local_3c;
  for (local_3c = 0; iVar2 = Saig_ManRegNum(pAig), local_3c < iVar2; local_3c = local_3c + 1) {
    pVVar1 = pAig->vCos;
    iVar2 = Saig_ManPoNum(pAig);
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_3c + iVar2);
    pAVar6 = Aig_ObjChild0Copy(pAVar5);
    pAVar6 = Aig_ObjCreateCo(p,pAVar6);
    (pAVar5->field_5).pData = pAVar6;
  }
  iVar2 = Aig_ManRegNum(pAig);
  Aig_ManSetRegNum(p,iVar2);
  Aig_ManCleanup(p);
  iVar2 = Aig_ManCheck(p);
  if (iVar2 != 0) {
    return p;
  }
  __assert_fail("Aig_ManCheck( pNewAig )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kLiveConstraints.c"
                ,0x8c,"Aig_Man_t *createNewAigWith0LivePo(Aig_Man_t *, Vec_Ptr_t *, int *)");
}

Assistant:

Aig_Man_t *createNewAigWith0LivePo( Aig_Man_t *pAig, Vec_Ptr_t *signalList, int *index0Live )
{
	Aig_Man_t *pNewAig;
	Aig_Obj_t *pObj, *pObjNewPoDriver;
	int i;

	//assert( Vec_PtrSize( signalList ) > 1 );

	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_0Live") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "0Live");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCi( pNewAig );
	}

	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		pObj->pData = Aig_ObjCreateCi( pNewAig );
    	}

	//********************************************************************
	// Step 7: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}

	Saig_ManForEachPo( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	pObjNewPoDriver = createConstrained0LiveCone( pNewAig, signalList );
	Aig_ObjCreateCo( pNewAig, pObjNewPoDriver );
	*index0Live = i;

	Saig_ManForEachLi( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}

	Aig_ManSetRegNum( pNewAig, Aig_ManRegNum(pAig) );
	Aig_ManCleanup( pNewAig );

	assert( Aig_ManCheck( pNewAig ) );
	return pNewAig;
}